

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

ssize_t __thiscall ktx::OutputStream::write(OutputStream *this,int __fd,void *__buf,size_t __n)

{
  pointer __s1;
  size_type sVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined4 in_register_00000034;
  size_type __rlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pvVar3 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,
                          (FILE *)this->file);
  if (pvVar3 != __buf) {
    __s1 = (this->filepath)._M_dataplus._M_p;
    sVar1 = (this->filepath)._M_string_length;
    if ((sVar1 == 1) && (iVar2 = bcmp(__s1,"-",1), iVar2 == 0)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60.field_2._M_allocated_capacity._0_4_ = 0x6f647473;
      local_60.field_2._M_allocated_capacity._4_2_ = 0x7475;
      local_60._M_string_length = 6;
      local_60.field_2._M_local_buf[6] = '\0';
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s1,__s1 + sVar1);
    }
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    plVar5 = (long *)std::_V2::generic_category();
    (**(code **)(*plVar5 + 0x20))(&local_40,plVar5,iVar2);
    Reporter::fatal<char_const(&)[38],std::__cxx11::string,std::__cxx11::string>
              ((Reporter *)__n,IO_FAILURE,(char (*) [38])"Failed to write output file \"{}\": {}.",
               &local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    paVar6 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar6) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT17(local_60.field_2._M_local_buf[7],
                               CONCAT16(local_60.field_2._M_local_buf[6],
                                        CONCAT24(local_60.field_2._M_allocated_capacity._4_2_,
                                                 local_60.field_2._M_allocated_capacity._0_4_))) + 1
                     );
      paVar6 = extraout_RAX;
    }
    return (ssize_t)paVar6;
  }
  return (ssize_t)pvVar3;
}

Assistant:

void OutputStream::write(const char* data, std::size_t size, Reporter& report) {
    const auto written = std::fwrite(data, 1, size, file);
    if (written != size)
        report.fatal(rc::IO_FAILURE, "Failed to write output file \"{}\": {}.", fmtOutFile(filepath), errnoMessage());
}